

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execAndiRg<(moira::Instr)60,(moira::Mode)0,(moira::Size)1>(Moira *this,u16 opcode)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  u32 uVar4;
  u32 result;
  
  bVar1 = (byte)(this->queue).irc;
  readExt(this);
  bVar2 = *(byte *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58);
  bVar3 = bVar2 ^ bVar1;
  (this->reg).sr.n = 0x7f < bVar3;
  (this->reg).sr.z = bVar2 == bVar1;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  uVar4 = (this->reg).pc;
  (this->reg).pc0 = uVar4;
  (this->queue).ird = (this->queue).irc;
  uVar4 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar4 + 2);
  (this->queue).irc = (u16)uVar4;
  *(byte *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58) = bVar3;
  return;
}

Assistant:

void
Moira::execAndiRg(u16 opcode)
{
    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    u32 result = logic<I,S>(src, readD<S>(dst));
    prefetch<POLLIPL>();

    if (S == Long) sync(4);
    writeD<S>(dst, result);
}